

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::CAPIExternalCommand::processDependencyInfoDiscoveredDependencies(llbuild::
buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,std::__cxx11
::string)::DepsActions::actOnInput(llvm::StringRef_(void *this,StringRef path)

{
  BuildSystemDelegate *pBVar1;
  size_t in_RCX;
  StringRef path_00;
  string local_70 [32];
  string local_50 [32];
  
  path_00.Data = (char *)path.Length;
  path_00.Length = in_RCX;
  llbuild::buildsystem::BuildKey::makeNode((BuildKey *)local_70,(BuildKey *)path.Data,path_00);
  std::__cxx11::string::string(local_50,local_70);
  llbuild::core::TaskInterface::discoveredDependency
            ((TaskInterface *)((long)this + 0x10),(KeyType *)local_50);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  pBVar1 = llbuild::buildsystem::BuildSystem::getDelegate(*(BuildSystem **)((long)this + 8));
  (*pBVar1->_vptr_BuildSystemDelegate[0xf])
            (pBVar1,*(undefined8 *)((long)this + 0x20),(BuildKey *)path.Data,path_00.Data,0);
  return;
}

Assistant:

virtual void actOnInput(StringRef path) override {
        ti.discoveredDependency(BuildKey::makeNode(path).toData());
        system.getDelegate().commandFoundDiscoveredDependency(command, path, DiscoveredDependencyKind::Input);
      }